

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_compact.cpp
# Opt level: O2

void anon_unknown.dwarf_1e726f::getResourceBundleKey
               (char *nsName,CompactStyle compactStyle,CompactType compactType,CharString *sb,
               UErrorCode *status)

{
  char *pcVar1;
  StringPiece local_70;
  StringPiece local_60;
  StringPiece local_50;
  StringPiece local_40;
  
  sb->len = 0;
  *(sb->buffer).ptr = '\0';
  icu_63::StringPiece::StringPiece(&local_40,"NumberElements/");
  icu_63::CharString::append(sb,local_40.ptr_,local_40.length_,status);
  icu_63::StringPiece::StringPiece(&local_50,nsName);
  icu_63::CharString::append(sb,local_50.ptr_,local_50.length_,status);
  pcVar1 = "/patternsLong";
  if (compactStyle == UNUM_SHORT) {
    pcVar1 = "/patternsShort";
  }
  icu_63::StringPiece::StringPiece(&local_60,pcVar1);
  icu_63::CharString::append(sb,local_60.ptr_,local_60.length_,status);
  pcVar1 = "/currencyFormat";
  if (compactType == TYPE_DECIMAL) {
    pcVar1 = "/decimalFormat";
  }
  icu_63::StringPiece::StringPiece(&local_70,pcVar1);
  icu_63::CharString::append(sb,local_70.ptr_,local_70.length_,status);
  return;
}

Assistant:

void getResourceBundleKey(const char *nsName, CompactStyle compactStyle, CompactType compactType,
                                 CharString &sb, UErrorCode &status) {
    sb.clear();
    sb.append("NumberElements/", status);
    sb.append(nsName, status);
    sb.append(compactStyle == CompactStyle::UNUM_SHORT ? "/patternsShort" : "/patternsLong", status);
    sb.append(compactType == CompactType::TYPE_DECIMAL ? "/decimalFormat" : "/currencyFormat", status);
}